

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O2

void subtract_8x8(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  uint16_t *puVar1;
  int16_t *piVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  uint16_t uVar45;
  uint16_t uVar46;
  uint16_t uVar47;
  uint16_t uVar48;
  uint16_t uVar49;
  uint16_t uVar50;
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  uint16_t uVar81;
  uint16_t uVar82;
  uint16_t uVar83;
  uint16_t uVar84;
  uint16_t uVar85;
  uint16_t uVar86;
  uint16_t uVar87;
  uint16_t uVar88;
  uint16_t uVar89;
  uint16_t uVar90;
  uint16_t uVar91;
  uint16_t uVar92;
  uint16_t uVar93;
  uint16_t uVar94;
  uint16_t uVar95;
  uint16_t uVar96;
  uint16_t uVar97;
  uint16_t uVar98;
  uint16_t uVar99;
  uint16_t uVar100;
  uint16_t uVar101;
  uint16_t uVar102;
  uint16_t uVar103;
  uint16_t uVar104;
  uint16_t uVar105;
  uint16_t uVar106;
  uint16_t uVar107;
  uint16_t uVar108;
  uint16_t uVar109;
  uint16_t uVar110;
  uint16_t uVar111;
  uint16_t uVar112;
  uint16_t uVar113;
  uint16_t uVar114;
  uint16_t uVar115;
  uint16_t uVar116;
  uint16_t uVar117;
  uint16_t uVar118;
  uint16_t uVar119;
  uint16_t uVar120;
  uint16_t uVar121;
  uint16_t uVar122;
  uint16_t uVar123;
  uint16_t uVar124;
  uint16_t uVar125;
  uint16_t uVar126;
  uint16_t uVar127;
  uint16_t uVar128;
  
  uVar3 = src[1];
  uVar4 = src[2];
  uVar5 = src[3];
  uVar6 = src[4];
  uVar7 = src[5];
  uVar8 = src[6];
  uVar9 = src[7];
  puVar1 = src + src_stride;
  uVar10 = *puVar1;
  uVar11 = puVar1[1];
  uVar12 = puVar1[2];
  uVar13 = puVar1[3];
  uVar14 = puVar1[4];
  uVar15 = puVar1[5];
  uVar16 = puVar1[6];
  uVar17 = puVar1[7];
  puVar1 = src + src_stride * 2;
  uVar18 = *puVar1;
  uVar19 = puVar1[1];
  uVar20 = puVar1[2];
  uVar21 = puVar1[3];
  uVar22 = puVar1[4];
  uVar23 = puVar1[5];
  uVar24 = puVar1[6];
  uVar25 = puVar1[7];
  puVar1 = src + src_stride * 3;
  uVar26 = *puVar1;
  uVar27 = puVar1[1];
  uVar28 = puVar1[2];
  uVar29 = puVar1[3];
  uVar30 = puVar1[4];
  uVar31 = puVar1[5];
  uVar32 = puVar1[6];
  uVar33 = puVar1[7];
  puVar1 = src + src_stride * 4;
  uVar34 = *puVar1;
  uVar35 = puVar1[1];
  uVar36 = puVar1[2];
  uVar37 = puVar1[3];
  uVar38 = puVar1[4];
  uVar39 = puVar1[5];
  uVar40 = puVar1[6];
  uVar41 = puVar1[7];
  puVar1 = src + src_stride * 5;
  uVar42 = *puVar1;
  uVar43 = puVar1[1];
  uVar44 = puVar1[2];
  uVar45 = puVar1[3];
  uVar46 = puVar1[4];
  uVar47 = puVar1[5];
  uVar48 = puVar1[6];
  uVar49 = puVar1[7];
  puVar1 = src + src_stride * 6;
  uVar50 = *puVar1;
  uVar51 = puVar1[1];
  uVar52 = puVar1[2];
  uVar53 = puVar1[3];
  uVar54 = puVar1[4];
  uVar55 = puVar1[5];
  uVar56 = puVar1[6];
  uVar57 = puVar1[7];
  puVar1 = src + src_stride * 7;
  uVar58 = *puVar1;
  uVar59 = puVar1[1];
  uVar60 = puVar1[2];
  uVar61 = puVar1[3];
  uVar62 = puVar1[4];
  uVar63 = puVar1[5];
  uVar64 = puVar1[6];
  uVar65 = puVar1[7];
  uVar66 = pred[1];
  uVar67 = pred[2];
  uVar68 = pred[3];
  uVar69 = pred[4];
  uVar70 = pred[5];
  uVar71 = pred[6];
  uVar72 = pred[7];
  puVar1 = pred + pred_stride;
  uVar73 = *puVar1;
  uVar74 = puVar1[1];
  uVar75 = puVar1[2];
  uVar76 = puVar1[3];
  uVar77 = puVar1[4];
  uVar78 = puVar1[5];
  uVar79 = puVar1[6];
  uVar80 = puVar1[7];
  puVar1 = pred + pred_stride * 2;
  uVar81 = *puVar1;
  uVar82 = puVar1[1];
  uVar83 = puVar1[2];
  uVar84 = puVar1[3];
  uVar85 = puVar1[4];
  uVar86 = puVar1[5];
  uVar87 = puVar1[6];
  uVar88 = puVar1[7];
  puVar1 = pred + pred_stride * 3;
  uVar89 = *puVar1;
  uVar90 = puVar1[1];
  uVar91 = puVar1[2];
  uVar92 = puVar1[3];
  uVar93 = puVar1[4];
  uVar94 = puVar1[5];
  uVar95 = puVar1[6];
  uVar96 = puVar1[7];
  puVar1 = pred + pred_stride * 4;
  uVar97 = *puVar1;
  uVar98 = puVar1[1];
  uVar99 = puVar1[2];
  uVar100 = puVar1[3];
  uVar101 = puVar1[4];
  uVar102 = puVar1[5];
  uVar103 = puVar1[6];
  uVar104 = puVar1[7];
  puVar1 = pred + pred_stride * 5;
  uVar105 = *puVar1;
  uVar106 = puVar1[1];
  uVar107 = puVar1[2];
  uVar108 = puVar1[3];
  uVar109 = puVar1[4];
  uVar110 = puVar1[5];
  uVar111 = puVar1[6];
  uVar112 = puVar1[7];
  puVar1 = pred + pred_stride * 6;
  uVar113 = *puVar1;
  uVar114 = puVar1[1];
  uVar115 = puVar1[2];
  uVar116 = puVar1[3];
  uVar117 = puVar1[4];
  uVar118 = puVar1[5];
  uVar119 = puVar1[6];
  uVar120 = puVar1[7];
  puVar1 = pred + pred_stride * 7;
  uVar121 = *puVar1;
  uVar122 = puVar1[1];
  uVar123 = puVar1[2];
  uVar124 = puVar1[3];
  uVar125 = puVar1[4];
  uVar126 = puVar1[5];
  uVar127 = puVar1[6];
  uVar128 = puVar1[7];
  *diff = *src - *pred;
  diff[1] = uVar3 - uVar66;
  diff[2] = uVar4 - uVar67;
  diff[3] = uVar5 - uVar68;
  diff[4] = uVar6 - uVar69;
  diff[5] = uVar7 - uVar70;
  diff[6] = uVar8 - uVar71;
  diff[7] = uVar9 - uVar72;
  piVar2 = diff + diff_stride;
  *piVar2 = uVar10 - uVar73;
  piVar2[1] = uVar11 - uVar74;
  piVar2[2] = uVar12 - uVar75;
  piVar2[3] = uVar13 - uVar76;
  piVar2[4] = uVar14 - uVar77;
  piVar2[5] = uVar15 - uVar78;
  piVar2[6] = uVar16 - uVar79;
  piVar2[7] = uVar17 - uVar80;
  piVar2 = diff + diff_stride * 2;
  *piVar2 = uVar18 - uVar81;
  piVar2[1] = uVar19 - uVar82;
  piVar2[2] = uVar20 - uVar83;
  piVar2[3] = uVar21 - uVar84;
  piVar2[4] = uVar22 - uVar85;
  piVar2[5] = uVar23 - uVar86;
  piVar2[6] = uVar24 - uVar87;
  piVar2[7] = uVar25 - uVar88;
  piVar2 = diff + diff_stride * 3;
  *piVar2 = uVar26 - uVar89;
  piVar2[1] = uVar27 - uVar90;
  piVar2[2] = uVar28 - uVar91;
  piVar2[3] = uVar29 - uVar92;
  piVar2[4] = uVar30 - uVar93;
  piVar2[5] = uVar31 - uVar94;
  piVar2[6] = uVar32 - uVar95;
  piVar2[7] = uVar33 - uVar96;
  piVar2 = diff + diff_stride * 4;
  *piVar2 = uVar34 - uVar97;
  piVar2[1] = uVar35 - uVar98;
  piVar2[2] = uVar36 - uVar99;
  piVar2[3] = uVar37 - uVar100;
  piVar2[4] = uVar38 - uVar101;
  piVar2[5] = uVar39 - uVar102;
  piVar2[6] = uVar40 - uVar103;
  piVar2[7] = uVar41 - uVar104;
  piVar2 = diff + diff_stride * 5;
  *piVar2 = uVar42 - uVar105;
  piVar2[1] = uVar43 - uVar106;
  piVar2[2] = uVar44 - uVar107;
  piVar2[3] = uVar45 - uVar108;
  piVar2[4] = uVar46 - uVar109;
  piVar2[5] = uVar47 - uVar110;
  piVar2[6] = uVar48 - uVar111;
  piVar2[7] = uVar49 - uVar112;
  piVar2 = diff + diff_stride * 6;
  *piVar2 = uVar50 - uVar113;
  piVar2[1] = uVar51 - uVar114;
  piVar2[2] = uVar52 - uVar115;
  piVar2[3] = uVar53 - uVar116;
  piVar2[4] = uVar54 - uVar117;
  piVar2[5] = uVar55 - uVar118;
  piVar2[6] = uVar56 - uVar119;
  piVar2[7] = uVar57 - uVar120;
  piVar2 = diff + diff_stride * 7;
  *piVar2 = uVar58 - uVar121;
  piVar2[1] = uVar59 - uVar122;
  piVar2[2] = uVar60 - uVar123;
  piVar2[3] = uVar61 - uVar124;
  piVar2[4] = uVar62 - uVar125;
  piVar2[5] = uVar63 - uVar126;
  piVar2[6] = uVar64 - uVar127;
  piVar2[7] = uVar65 - uVar128;
  return;
}

Assistant:

static void subtract_8x8(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;

  u0 = _mm_loadu_si128((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadu_si128((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadu_si128((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadu_si128((__m128i const *)(src + 3 * src_stride));
  u4 = _mm_loadu_si128((__m128i const *)(src + 4 * src_stride));
  u5 = _mm_loadu_si128((__m128i const *)(src + 5 * src_stride));
  u6 = _mm_loadu_si128((__m128i const *)(src + 6 * src_stride));
  u7 = _mm_loadu_si128((__m128i const *)(src + 7 * src_stride));

  v0 = _mm_loadu_si128((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadu_si128((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadu_si128((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadu_si128((__m128i const *)(pred + 3 * pred_stride));
  v4 = _mm_loadu_si128((__m128i const *)(pred + 4 * pred_stride));
  v5 = _mm_loadu_si128((__m128i const *)(pred + 5 * pred_stride));
  v6 = _mm_loadu_si128((__m128i const *)(pred + 6 * pred_stride));
  v7 = _mm_loadu_si128((__m128i const *)(pred + 7 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);
  x4 = _mm_sub_epi16(u4, v4);
  x5 = _mm_sub_epi16(u5, v5);
  x6 = _mm_sub_epi16(u6, v6);
  x7 = _mm_sub_epi16(u7, v7);

  _mm_storeu_si128((__m128i *)(diff + 0 * diff_stride), x0);
  _mm_storeu_si128((__m128i *)(diff + 1 * diff_stride), x1);
  _mm_storeu_si128((__m128i *)(diff + 2 * diff_stride), x2);
  _mm_storeu_si128((__m128i *)(diff + 3 * diff_stride), x3);
  _mm_storeu_si128((__m128i *)(diff + 4 * diff_stride), x4);
  _mm_storeu_si128((__m128i *)(diff + 5 * diff_stride), x5);
  _mm_storeu_si128((__m128i *)(diff + 6 * diff_stride), x6);
  _mm_storeu_si128((__m128i *)(diff + 7 * diff_stride), x7);
}